

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_calculate_frame_count_after_resampling
                    (ma_uint32 sampleRateOut,ma_uint32 sampleRateIn,ma_uint64 frameCountIn)

{
  ma_uint64 preliminaryInputFrameCount;
  ma_uint64 preliminaryInputFrameCountFromFrac;
  ma_uint64 outputFrameCount;
  ma_uint64 frameCountIn_local;
  ma_uint32 sampleRateIn_local;
  ma_uint32 sampleRateOut_local;
  undefined8 local_8;
  
  if (((sampleRateIn == 0) || (sampleRateOut == 0)) || (frameCountIn == 0)) {
    local_8 = 0;
  }
  else {
    local_8 = frameCountIn;
    if (sampleRateOut != sampleRateIn) {
      outputFrameCount = (frameCountIn * sampleRateOut) / (ulong)sampleRateIn;
      if (outputFrameCount * ((ulong)sampleRateIn % (ulong)sampleRateOut) +
          (outputFrameCount * ((ulong)sampleRateIn / (ulong)sampleRateOut)) / (ulong)sampleRateOut
          <= frameCountIn) {
        outputFrameCount = outputFrameCount + 1;
      }
      local_8 = outputFrameCount;
    }
  }
  return local_8;
}

Assistant:

MA_API ma_uint64 ma_calculate_frame_count_after_resampling(ma_uint32 sampleRateOut, ma_uint32 sampleRateIn, ma_uint64 frameCountIn)
{
    /* This is based on the calculation in ma_linear_resampler_get_expected_output_frame_count(). */
    ma_uint64 outputFrameCount;
    ma_uint64 preliminaryInputFrameCountFromFrac;
    ma_uint64 preliminaryInputFrameCount;

    if (sampleRateIn == 0 || sampleRateOut == 0 || frameCountIn == 0) {
        return 0;
    }

    if (sampleRateOut == sampleRateIn) {
        return frameCountIn;
    }

    outputFrameCount = (frameCountIn * sampleRateOut) / sampleRateIn;

    preliminaryInputFrameCountFromFrac = (outputFrameCount * (sampleRateIn / sampleRateOut)) / sampleRateOut;
    preliminaryInputFrameCount         = (outputFrameCount * (sampleRateIn % sampleRateOut)) + preliminaryInputFrameCountFromFrac;

    if (preliminaryInputFrameCount <= frameCountIn) {
        outputFrameCount += 1;
    }

    return outputFrameCount;
}